

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool dg::vr::RelationsAnalyzer::isDangerous(I inst)

{
  bool bVar1;
  
  bVar1 = true;
  if ((inst != (I)0x0) && (inst[0x10] == (Instruction)0x3c)) {
    bVar1 = *(byte *)(*(long *)(inst + -0x20) + 0x10) < 0x14;
  }
  return bVar1;
}

Assistant:

bool RelationsAnalyzer::isDangerous(I inst) {
    const auto *store = llvm::dyn_cast<llvm::StoreInst>(inst);
    if (!store) // most probably CallInst
        // unable to presume anything about such instruction
        return true;

    // if store writes to a fix location, it cannot be easily said which
    // values it affects
    if (llvm::isa<llvm::Constant>(store->getPointerOperand()))
        return true;

    return false;
}